

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
cbtConvexConcaveCollisionAlgorithm::processCollision
          (cbtConvexConcaveCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  undefined8 uVar1;
  cbtCollisionShape *pcVar2;
  cbtPersistentManifold *pcVar3;
  cbtCollisionObject *pcVar4;
  float fVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int v;
  ulong uVar9;
  long lVar10;
  cbtSphereShape *sphere;
  cbtCollisionObjectWrapper *triBodyWrap;
  int v_1;
  long lVar11;
  cbtScalar in_XMM0_Da;
  undefined1 auVar12 [64];
  undefined1 auVar15 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  cbtVector3 cVar22;
  cbtVector3 cVar23;
  CProfileSample __profile;
  cbtScalar dist;
  cbtVector3 vtx;
  cbtConcaveShape *concaveShape;
  cbtAlignedObjectArray<cbtVector3> queryVertices;
  cbtVector3 normal;
  cbtVector3 vtxInSdf;
  cbtVector3 normalLocal;
  CProfileSample local_bd;
  float local_bc;
  cbtManifoldResult *local_b8;
  cbtConvexConcaveCollisionAlgorithm *local_b0;
  cbtVector3 local_a8;
  cbtSdfCollisionShape *local_98;
  cbtAlignedObjectArray<cbtVector3> local_90;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  local_b8 = resultOut;
  CProfileSample::CProfileSample(&local_bd,"cbtConvexConcaveCollisionAlgorithm::processCollision");
  triBodyWrap = body1Wrap;
  if (this->m_isSwapped != false) {
    triBodyWrap = body0Wrap;
    body0Wrap = body1Wrap;
  }
  local_98 = (cbtSdfCollisionShape *)triBodyWrap->m_shape;
  iVar7 = (local_98->super_cbtConcaveShape).super_cbtCollisionShape.m_shapeType;
  if (iVar7 - 0x19U < 0xb) {
    pcVar2 = body0Wrap->m_shape;
    iVar8 = pcVar2->m_shapeType;
    if (iVar7 == 0x23) {
      if (iVar8 < 0x18) {
        local_90.m_ownsMemory = true;
        local_90.m_data = (cbtVector3 *)0x0;
        local_90.m_size = 0;
        local_90.m_capacity = 0;
        if (iVar8 < 7) {
          uVar9 = 0;
          local_b0 = this;
          while( true ) {
            iVar7 = (*pcVar2->_vptr_cbtCollisionShape[0x19])(pcVar2);
            if (iVar7 <= (int)uVar9) break;
            (*pcVar2->_vptr_cbtCollisionShape[0x1c])(pcVar2,uVar9,&local_a8);
            cbtAlignedObjectArray<cbtVector3>::push_back(&local_90,&local_a8);
            uVar9 = (ulong)((int)uVar9 + 1);
          }
          iVar8 = pcVar2->m_shapeType;
          this = local_b0;
        }
        if (iVar8 == 8) {
          local_a8.m_floats = (cbtScalar  [4])ZEXT816(0);
          cbtAlignedObjectArray<cbtVector3>::push_back(&local_90,&local_a8);
          auVar12 = ZEXT464((uint)(*(float *)&pcVar2[1].field_0xc * *(float *)&pcVar2->field_0x1c +
                                  1.1920929e-07));
        }
        else {
          auVar12 = ZEXT464(0x34000000);
        }
        local_b0 = (cbtConvexConcaveCollisionAlgorithm *)CONCAT44(local_b0._4_4_,auVar12._0_4_);
        if (local_90.m_size != 0) {
          lVar10 = 0;
          lVar11 = 0;
          local_b8->m_manifoldPtr = (this->m_cbtConvexTriangleCallback).m_manifoldPtr;
          while( true ) {
            auVar18 = in_ZMM1._8_56_;
            auVar15 = auVar12._8_56_;
            if (local_90.m_size <= lVar11) break;
            cVar22 = cbtTransform::operator()
                               (body0Wrap->m_worldTransform,
                                (cbtVector3 *)((long)(local_90.m_data)->m_floats + lVar10));
            auVar16._0_8_ = cVar22.m_floats._8_8_;
            auVar16._8_56_ = auVar18;
            auVar12._0_8_ = cVar22.m_floats._0_8_;
            auVar12._8_56_ = auVar15;
            local_a8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar12._0_16_,auVar16._0_16_);
            auVar15 = ZEXT856(local_a8.m_floats._8_8_);
            cVar22 = cbtTransform::invXform(triBodyWrap->m_worldTransform,&local_a8);
            in_ZMM1._0_8_ = cVar22.m_floats._8_8_;
            in_ZMM1._8_56_ = auVar18;
            auVar13._0_8_ = cVar22.m_floats._0_8_;
            auVar13._8_56_ = auVar15;
            local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar13._0_16_,in_ZMM1._0_16_);
            bVar6 = cbtSdfCollisionShape::queryPoint(local_98,&local_50,&local_bc,&local_40);
            auVar18 = in_ZMM1._8_56_;
            auVar12 = ZEXT464((uint)local_b0._0_4_);
            auVar15 = (undefined1  [56])0x0;
            if (bVar6 && local_bc <= local_b0._0_4_) {
              cbtVector3::safeNormalize(&local_40);
              cVar23 = ::operator*(&triBodyWrap->m_worldTransform->m_basis,&local_40);
              cVar22.m_floats = local_a8.m_floats;
              auVar17._0_8_ = cVar23.m_floats._8_8_;
              auVar17._8_56_ = auVar18;
              auVar14._0_8_ = cVar23.m_floats._0_8_;
              auVar14._8_56_ = auVar15;
              local_60 = vmovlhps_avx(auVar14._0_16_,auVar17._0_16_);
              auVar20._8_8_ = 0;
              auVar20._0_4_ = local_a8.m_floats[0];
              auVar20._4_4_ = local_a8.m_floats[1];
              local_a8.m_floats[2] = cVar22.m_floats[2];
              fVar5 = local_a8.m_floats[2];
              if (pcVar2->m_shapeType == 8) {
                fVar5 = *(float *)&pcVar2[1].field_0xc * *(float *)&pcVar2->field_0x1c;
                local_bc = local_bc - fVar5;
                auVar21._0_4_ = fVar5 * cVar23.m_floats[0];
                auVar21._4_4_ = fVar5 * cVar23.m_floats[1];
                auVar21._8_4_ = fVar5 * auVar15._0_4_;
                auVar21._12_4_ = fVar5 * auVar15._4_4_;
                fVar5 = local_a8.m_floats[2] - fVar5 * cVar23.m_floats[2];
                auVar20 = vsubps_avx(auVar20,auVar21);
                uVar1 = vmovlps_avx(auVar20);
                local_a8.m_floats[3] = cVar22.m_floats[3];
                local_a8.m_floats[2] = fVar5;
                local_a8.m_floats[0] = (cbtScalar)(int)uVar1;
                local_a8.m_floats[1] = (cbtScalar)(int)((ulong)uVar1 >> 0x20);
                cVar22.m_floats = local_a8.m_floats;
              }
              local_a8.m_floats = cVar22.m_floats;
              auVar12 = ZEXT464((uint)local_bc);
              auVar19._0_4_ = cVar23.m_floats[0] * local_bc;
              auVar19._4_4_ = cVar23.m_floats[1] * local_bc;
              auVar19._8_4_ = auVar15._0_4_ * local_bc;
              auVar19._12_4_ = auVar15._4_4_ * local_bc;
              auVar20 = vsubps_avx(auVar20,auVar19);
              local_70 = vinsertps_avx(auVar20,ZEXT416((uint)(fVar5 - local_bc * cVar23.m_floats[2])
                                                      ),0x28);
              in_ZMM1 = ZEXT1664(local_70);
              (*(local_b8->super_Result)._vptr_Result[4])(local_b8,local_60,local_70);
            }
            lVar11 = lVar11 + 1;
            lVar10 = lVar10 + 0x10;
          }
          cbtManifoldResult::refreshContactPoints(local_b8);
        }
        cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_90);
      }
    }
    else if (iVar8 < 0x18) {
      (*(local_98->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
      local_b8->m_manifoldPtr = (this->m_cbtConvexTriangleCallback).m_manifoldPtr;
      cbtConvexTriangleCallback::setTimeStepAndCounters
                (&this->m_cbtConvexTriangleCallback,in_XMM0_Da,dispatchInfo,body0Wrap,triBodyWrap,
                 local_b8);
      pcVar3 = (this->m_cbtConvexTriangleCallback).m_manifoldPtr;
      pcVar4 = triBodyWrap->m_collisionObject;
      pcVar3->m_body0 = body0Wrap->m_collisionObject;
      pcVar3->m_body1 = pcVar4;
      (*(local_98->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
                (local_98,&this->m_cbtConvexTriangleCallback,
                 &(this->m_cbtConvexTriangleCallback).m_aabbMin,
                 &(this->m_cbtConvexTriangleCallback).m_aabbMax);
      cbtManifoldResult::refreshContactPoints(local_b8);
      (this->m_cbtConvexTriangleCallback).m_convexBodyWrap = (cbtCollisionObjectWrapper *)0x0;
      (this->m_cbtConvexTriangleCallback).m_triBodyWrap = (cbtCollisionObjectWrapper *)0x0;
    }
  }
  CProfileSample::~CProfileSample(&local_bd);
  return;
}

Assistant:

void cbtConvexConcaveCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	BT_PROFILE("cbtConvexConcaveCollisionAlgorithm::processCollision");

	const cbtCollisionObjectWrapper* convexBodyWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* triBodyWrap = m_isSwapped ? body0Wrap : body1Wrap;

	if (triBodyWrap->getCollisionShape()->isConcave())
	{
		if (triBodyWrap->getCollisionShape()->getShapeType() == SDF_SHAPE_PROXYTYPE)
		{
			cbtSdfCollisionShape* sdfShape = (cbtSdfCollisionShape*)triBodyWrap->getCollisionShape();
			if (convexBodyWrap->getCollisionShape()->isConvex())
			{
				cbtConvexShape* convex = (cbtConvexShape*)convexBodyWrap->getCollisionShape();
				cbtAlignedObjectArray<cbtVector3> queryVertices;

				if (convex->isPolyhedral())
				{
					cbtPolyhedralConvexShape* poly = (cbtPolyhedralConvexShape*)convex;
					for (int v = 0; v < poly->getNumVertices(); v++)
					{
						cbtVector3 vtx;
						poly->getVertex(v, vtx);
						queryVertices.push_back(vtx);
					}
				}
				cbtScalar maxDist = SIMD_EPSILON;

				if (convex->getShapeType() == SPHERE_SHAPE_PROXYTYPE)
				{
					queryVertices.push_back(cbtVector3(0, 0, 0));
					cbtSphereShape* sphere = (cbtSphereShape*)convex;
					maxDist = sphere->getRadius() + SIMD_EPSILON;
				}
				if (queryVertices.size())
				{
					resultOut->setPersistentManifold(m_cbtConvexTriangleCallback.m_manifoldPtr);
					//m_cbtConvexTriangleCallback.m_manifoldPtr->clearManifold();

					cbtPolyhedralConvexShape* poly = (cbtPolyhedralConvexShape*)convex;
					for (int v = 0; v < queryVertices.size(); v++)
					{
						const cbtVector3& vtx = queryVertices[v];
						cbtVector3 vtxWorldSpace = convexBodyWrap->getWorldTransform() * vtx;
						cbtVector3 vtxInSdf = triBodyWrap->getWorldTransform().invXform(vtxWorldSpace);

						cbtVector3 normalLocal;
						cbtScalar dist;
						if (sdfShape->queryPoint(vtxInSdf, dist, normalLocal))
						{
							if (dist <= maxDist)
							{
								normalLocal.safeNormalize();
								cbtVector3 normal = triBodyWrap->getWorldTransform().getBasis() * normalLocal;

								if (convex->getShapeType() == SPHERE_SHAPE_PROXYTYPE)
								{
									cbtSphereShape* sphere = (cbtSphereShape*)convex;
									dist -= sphere->getRadius();
									vtxWorldSpace -= sphere->getRadius() * normal;
								}
								resultOut->addContactPoint(normal, vtxWorldSpace - normal * dist, dist);
							}
						}
					}
					resultOut->refreshContactPoints();
				}
			}
		}
		else
		{
			const cbtConcaveShape* concaveShape = static_cast<const cbtConcaveShape*>(triBodyWrap->getCollisionShape());

			if (convexBodyWrap->getCollisionShape()->isConvex())
			{
				cbtScalar collisionMarginTriangle = concaveShape->getMargin();

				resultOut->setPersistentManifold(m_cbtConvexTriangleCallback.m_manifoldPtr);
				m_cbtConvexTriangleCallback.setTimeStepAndCounters(collisionMarginTriangle, dispatchInfo, convexBodyWrap, triBodyWrap, resultOut);

				m_cbtConvexTriangleCallback.m_manifoldPtr->setBodies(convexBodyWrap->getCollisionObject(), triBodyWrap->getCollisionObject());

				concaveShape->processAllTriangles(&m_cbtConvexTriangleCallback, m_cbtConvexTriangleCallback.getAabbMin(), m_cbtConvexTriangleCallback.getAabbMax());

				resultOut->refreshContactPoints();

				m_cbtConvexTriangleCallback.clearWrapperData();
			}
		}
	}
}